

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void AddVector_SSE2(uint32_t *a,uint32_t *b,uint32_t *out,int size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 *puVar17;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int i;
  int local_168;
  int iStack_88;
  int iStack_84;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  
  for (local_168 = 0; local_168 + 0x10 <= in_ECX; local_168 = local_168 + 0x10) {
    puVar17 = (undefined8 *)(in_RDI + (long)local_168 * 4);
    uVar1 = *puVar17;
    uVar2 = puVar17[1];
    puVar17 = (undefined8 *)(in_RDI + (long)(local_168 + 4) * 4);
    uVar3 = *puVar17;
    uVar4 = puVar17[1];
    puVar17 = (undefined8 *)(in_RDI + (long)(local_168 + 8) * 4);
    uVar5 = *puVar17;
    uVar6 = puVar17[1];
    puVar17 = (undefined8 *)(in_RDI + (long)(local_168 + 0xc) * 4);
    uVar7 = *puVar17;
    uVar8 = puVar17[1];
    puVar17 = (undefined8 *)(in_RSI + (long)local_168 * 4);
    uVar9 = *puVar17;
    uVar10 = puVar17[1];
    puVar17 = (undefined8 *)(in_RSI + (long)(local_168 + 4) * 4);
    uVar11 = *puVar17;
    uVar12 = puVar17[1];
    puVar17 = (undefined8 *)(in_RSI + (long)(local_168 + 8) * 4);
    uVar13 = *puVar17;
    uVar14 = puVar17[1];
    puVar17 = (undefined8 *)(in_RSI + (long)(local_168 + 0xc) * 4);
    uVar15 = *puVar17;
    uVar16 = puVar17[1];
    puVar17 = (undefined8 *)(in_RDX + (long)local_168 * 4);
    a1[1]._0_4_ = (int)uVar1;
    a1[1]._4_4_ = (int)((ulong)uVar1 >> 0x20);
    a0[0]._0_4_ = (int)uVar2;
    a0[0]._4_4_ = (int)((ulong)uVar2 >> 0x20);
    a2[1]._0_4_ = (int)uVar9;
    a2[1]._4_4_ = (int)((ulong)uVar9 >> 0x20);
    a1[0]._0_4_ = (int)uVar10;
    a1[0]._4_4_ = (int)((ulong)uVar10 >> 0x20);
    *puVar17 = CONCAT44(a1[1]._4_4_ + a2[1]._4_4_,(int)a1[1] + (int)a2[1]);
    puVar17[1] = CONCAT44(a0[0]._4_4_ + a1[0]._4_4_,(int)a0[0] + (int)a1[0]);
    puVar17 = (undefined8 *)(in_RDX + (long)(local_168 + 4) * 4);
    a3[1]._0_4_ = (int)uVar3;
    a3[1]._4_4_ = (int)((ulong)uVar3 >> 0x20);
    a2[0]._0_4_ = (int)uVar4;
    a2[0]._4_4_ = (int)((ulong)uVar4 >> 0x20);
    b0[1]._0_4_ = (int)uVar11;
    b0[1]._4_4_ = (int)((ulong)uVar11 >> 0x20);
    a3[0]._0_4_ = (int)uVar12;
    a3[0]._4_4_ = (int)((ulong)uVar12 >> 0x20);
    *puVar17 = CONCAT44(a3[1]._4_4_ + b0[1]._4_4_,(int)a3[1] + (int)b0[1]);
    puVar17[1] = CONCAT44(a2[0]._4_4_ + a3[0]._4_4_,(int)a2[0] + (int)a3[0]);
    puVar17 = (undefined8 *)(in_RDX + (long)(local_168 + 8) * 4);
    b1[1]._0_4_ = (int)uVar5;
    b1[1]._4_4_ = (int)((ulong)uVar5 >> 0x20);
    b0[0]._0_4_ = (int)uVar6;
    b0[0]._4_4_ = (int)((ulong)uVar6 >> 0x20);
    b2[1]._0_4_ = (int)uVar13;
    b2[1]._4_4_ = (int)((ulong)uVar13 >> 0x20);
    b1[0]._0_4_ = (int)uVar14;
    b1[0]._4_4_ = (int)((ulong)uVar14 >> 0x20);
    *puVar17 = CONCAT44(b1[1]._4_4_ + b2[1]._4_4_,(int)b1[1] + (int)b2[1]);
    puVar17[1] = CONCAT44(b0[0]._4_4_ + b1[0]._4_4_,(int)b0[0] + (int)b1[0]);
    puVar17 = (undefined8 *)(in_RDX + (long)(local_168 + 0xc) * 4);
    b3[1]._0_4_ = (int)uVar7;
    b3[1]._4_4_ = (int)((ulong)uVar7 >> 0x20);
    b2[0]._0_4_ = (int)uVar8;
    b2[0]._4_4_ = (int)((ulong)uVar8 >> 0x20);
    iStack_88 = (int)uVar15;
    iStack_84 = (int)((ulong)uVar15 >> 0x20);
    b3[0]._0_4_ = (int)uVar16;
    b3[0]._4_4_ = (int)((ulong)uVar16 >> 0x20);
    *puVar17 = CONCAT44(b3[1]._4_4_ + iStack_84,(int)b3[1] + iStack_88);
    puVar17[1] = CONCAT44(b2[0]._4_4_ + b3[0]._4_4_,(int)b2[0] + (int)b3[0]);
  }
  for (; local_168 < in_ECX; local_168 = local_168 + 1) {
    *(int *)(in_RDX + (long)local_168 * 4) =
         *(int *)(in_RDI + (long)local_168 * 4) + *(int *)(in_RSI + (long)local_168 * 4);
  }
  return;
}

Assistant:

static void AddVector_SSE2(const uint32_t* a, const uint32_t* b, uint32_t* out,
                           int size) {
  int i;
  for (i = 0; i + LINE_SIZE <= size; i += LINE_SIZE) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)&a[i +  0]);
    const __m128i a1 = _mm_loadu_si128((const __m128i*)&a[i +  4]);
#if (LINE_SIZE == 16)
    const __m128i a2 = _mm_loadu_si128((const __m128i*)&a[i +  8]);
    const __m128i a3 = _mm_loadu_si128((const __m128i*)&a[i + 12]);
#endif
    const __m128i b0 = _mm_loadu_si128((const __m128i*)&b[i +  0]);
    const __m128i b1 = _mm_loadu_si128((const __m128i*)&b[i +  4]);
#if (LINE_SIZE == 16)
    const __m128i b2 = _mm_loadu_si128((const __m128i*)&b[i +  8]);
    const __m128i b3 = _mm_loadu_si128((const __m128i*)&b[i + 12]);
#endif
    _mm_storeu_si128((__m128i*)&out[i +  0], _mm_add_epi32(a0, b0));
    _mm_storeu_si128((__m128i*)&out[i +  4], _mm_add_epi32(a1, b1));
#if (LINE_SIZE == 16)
    _mm_storeu_si128((__m128i*)&out[i +  8], _mm_add_epi32(a2, b2));
    _mm_storeu_si128((__m128i*)&out[i + 12], _mm_add_epi32(a3, b3));
#endif
  }
  for (; i < size; ++i) {
    out[i] = a[i] + b[i];
  }
}